

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metatype_create.cpp
# Opt level: O3

metatype * mpt::metatype::create(char *val,int len)

{
  size_t sVar1;
  metatype *pmVar2;
  ssize_t sVar3;
  metatype *pmVar4;
  encode_array *this;
  
  if (len < 0) {
    if (val == (char *)0x0) goto LAB_0012cd9b;
    sVar1 = strlen(val);
    len = (int)sVar1;
  }
  else if (val == (char *)0x0) {
LAB_0012cd9b:
    pmVar4 = io::buffer::metatype::create((array *)0x0);
    return &pmVar4->super_metatype;
  }
  if ((0xfe < len) || (pmVar4 = (metatype *)basic::create(val,len), pmVar4 == (metatype *)0x0)) {
    pmVar2 = io::buffer::metatype::create((array *)0x0);
    pmVar4 = (metatype *)0x0;
    if (pmVar2 != (metatype *)0x0) {
      if ((len == 0) ||
         (sVar3 = encode_array::push(&(pmVar2->super_buffer).super_encode_array,(long)len,val),
         -1 < sVar3)) {
        this = &(pmVar2->super_buffer).super_encode_array;
        encode_array::push(this,1,"");
        encode_array::push(this,0,(void *)0x0);
        pmVar4 = pmVar2;
      }
      else {
        (*(pmVar2->super_metatype).super_convertable._vptr_convertable[1])(pmVar2);
        pmVar4 = (metatype *)0x0;
      }
    }
  }
  return &pmVar4->super_metatype;
}

Assistant:

metatype *metatype::create(const char *val, int len)
{
	if (len < 0) {
		len = val ? strlen(val) : 0;
	}
	// compatible small generic metatype
	if (val && len < std::numeric_limits<uint8_t>::max()) {
		metatype *m = metatype::basic::create(val, len);
		if (m) {
			return m;
		}
	}
	// create buffer-backed text metatype
	io::buffer::metatype *b;
	if ((b = mpt::io::buffer::metatype::create(0))
	 && val) {
		if (len && b->push(len, val) < 0) {
			b->unref();
			return 0;
		}
		b->push(1, "\0"); // terminate string
		b->push(0, 0);    // mark content finished
	}
	return b;
}